

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  int iVar1;
  int iLit0;
  long lVar2;
  long lVar3;
  
  iVar1 = Abc_Base2Log(nNum);
  if (iVar1 < nShift) {
    lVar2 = (long)iVar1;
    iLit0 = pShift[lVar2];
    lVar3 = lVar2;
    while (lVar3 = lVar3 + 1, lVar3 < nShift) {
      iLit0 = Gia_ManHashOr(pNew,iLit0,pShift[lVar3]);
    }
    nShift = iVar1 + 1;
    pShift[lVar2] = iLit0;
  }
  Wlc_BlastShiftLeftInt(pNew,pNum,nNum,pShift,nShift,fSticky,vRes);
  return;
}

Assistant:

void Wlc_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    if ( nShiftMax < nShift )
    {
        int i, iRes = pShift[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShift[i] );
        pShift[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftLeftInt( pNew, pNum, nNum, pShift, nShiftMax, fSticky, vRes );
}